

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib666.c
# Opt level: O2

int test(char *URL)

{
  uint uVar1;
  char cVar2;
  int iVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  ulong uVar7;
  char *pcVar8;
  
  uVar7 = 0;
  while( true ) {
    uVar1 = (ushort)(uVar7 & 0xffffffff) / 0x1a;
    if (uVar7 == 17000) break;
    cVar2 = '\n';
    if ((short)((short)(uVar7 / 0x4d) * 0x4d + 0x4c) != (short)uVar7) {
      cVar2 = (char)uVar1 * -0x1a + 'A' + (char)uVar7;
    }
    buffer[uVar7] = cVar2;
    uVar7 = uVar7 + 1;
  }
  iVar3 = curl_global_init(3,CONCAT62((int6)((uVar7 & 0xffffffff) >> 0x10),(short)uVar1),
                           uVar7 % 0x4d);
  if (iVar3 != 0) {
    curl_mfprintf(_stderr,"curl_global_init() failed\n");
    return 0x7e;
  }
  lVar4 = curl_easy_init();
  if (lVar4 == 0) {
    pcVar8 = "curl_easy_init() failed\n";
LAB_00101351:
    lVar5 = 0;
  }
  else {
    lVar5 = curl_mime_init(lVar4);
    if (lVar5 == 0) {
      pcVar8 = "curl_mime_init() failed\n";
      goto LAB_00101351;
    }
    lVar6 = curl_mime_addpart(lVar5);
    if (lVar6 != 0) {
      iVar3 = curl_mime_name(lVar6,"upfile");
      if (iVar3 == 0) {
        iVar3 = curl_mime_filename(lVar6,"myfile.txt");
        if (iVar3 == 0) {
          iVar3 = curl_mime_data(lVar6,buffer,17000);
          if (iVar3 == 0) {
            iVar3 = curl_mime_encoder(lVar6,"binary");
            if (iVar3 == 0) {
              iVar3 = curl_easy_setopt(lVar4,0x2712,URL);
              if ((((iVar3 == 0) && (iVar3 = curl_easy_setopt(lVar4,0x281d,lVar5), iVar3 == 0)) &&
                  (iVar3 = curl_easy_setopt(lVar4,0x118,0x401b), iVar3 == 0)) &&
                 ((iVar3 = curl_easy_setopt(lVar4,0x29,1), iVar3 == 0 &&
                  (iVar3 = curl_easy_setopt(lVar4,0x2a,1), iVar3 == 0)))) {
                iVar3 = curl_easy_perform(lVar4);
              }
              goto LAB_001013f8;
            }
            pcVar8 = "curl_mime_encoder() failed\n";
          }
          else {
            pcVar8 = "curl_mime_data() failed\n";
          }
        }
        else {
          pcVar8 = "curl_mime_filename() failed\n";
        }
      }
      else {
        pcVar8 = "curl_mime_name() failed\n";
      }
      curl_mfprintf(_stderr,pcVar8);
      goto LAB_001013f8;
    }
    pcVar8 = "curl_mime_addpart() failed\n";
  }
  curl_mfprintf(_stderr,pcVar8);
  iVar3 = 0x7e;
LAB_001013f8:
  curl_easy_cleanup(lVar4);
  curl_mime_free(lVar5);
  curl_global_cleanup();
  return iVar3;
}

Assistant:

int test(char *URL)
{
  CURL *curl = NULL;
  CURLcode res = CURLE_OK;
  curl_mime *mime = NULL;
  curl_mimepart *part;
  size_t i;

  /* Checks huge binary-encoded mime post. */

  /* Create a buffer with pseudo-binary data. */
  for(i = 0; i < sizeof(buffer); i++)
    if(i % 77 == 76)
      buffer[i] = '\n';
    else
      buffer[i] = (char) (0x41 + i % 26); /* A...Z */

  if(curl_global_init(CURL_GLOBAL_ALL) != CURLE_OK) {
    fprintf(stderr, "curl_global_init() failed\n");
    return TEST_ERR_MAJOR_BAD;
  }

  curl = curl_easy_init();
  if(!curl) {
    fprintf(stderr, "curl_easy_init() failed\n");
    res = (CURLcode) TEST_ERR_MAJOR_BAD;
    goto test_cleanup;
  }

  /* Build mime structure. */
  mime = curl_mime_init(curl);
  if(!mime) {
    fprintf(stderr, "curl_mime_init() failed\n");
    res = (CURLcode) TEST_ERR_MAJOR_BAD;
    goto test_cleanup;
  }
  part = curl_mime_addpart(mime);
  if(!part) {
    fprintf(stderr, "curl_mime_addpart() failed\n");
    res = (CURLcode) TEST_ERR_MAJOR_BAD;
    goto test_cleanup;
  }
  res = curl_mime_name(part, "upfile");
  if(res) {
    fprintf(stderr, "curl_mime_name() failed\n");
    goto test_cleanup;
  }
  res = curl_mime_filename(part, "myfile.txt");
  if(res) {
    fprintf(stderr, "curl_mime_filename() failed\n");
    goto test_cleanup;
  }
  res = curl_mime_data(part, buffer, sizeof(buffer));
  if(res) {
    fprintf(stderr, "curl_mime_data() failed\n");
    goto test_cleanup;
  }
  res = curl_mime_encoder(part, "binary");
  if(res) {
    fprintf(stderr, "curl_mime_encoder() failed\n");
    goto test_cleanup;
  }

  /* First set the URL that is about to receive our mime mail. */
  test_setopt(curl, CURLOPT_URL, URL);

  /* Post form */
  test_setopt(curl, CURLOPT_MIMEPOST, mime);

  /* Shorten upload buffer. */
  test_setopt(curl, CURLOPT_UPLOAD_BUFFERSIZE, 16411L);

  /* get verbose debug output please */
  test_setopt(curl, CURLOPT_VERBOSE, 1L);

  /* include headers in the output */
  test_setopt(curl, CURLOPT_HEADER, 1L);

  /* Perform the request, res will get the return code */
  res = curl_easy_perform(curl);

test_cleanup:

  /* always cleanup */
  curl_easy_cleanup(curl);

  /* now cleanup the mime structure */
  curl_mime_free(mime);

  curl_global_cleanup();

  return res;
}